

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor)

{
  Matrix<double,__1,__1,_1,__1,__1> *xpr;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ChElementShellANCF_3443 *pCVar4;
  element_type *this_00;
  undefined1 (*pauVar5) [32];
  PointerType pdVar6;
  undefined8 uVar7;
  XprTypeNested pMVar8;
  variable_if_dynamic<long,__1> vVar9;
  variable_if_dynamic<long,__1> vVar10;
  Index IVar11;
  undefined1 auVar12 [24];
  long lVar13;
  Scalar *pSVar14;
  long startCol;
  long lVar15;
  ChElementShellANCF_3443 *this_01;
  int i;
  long lVar16;
  int i_2;
  long lVar17;
  long lVar18;
  Scalar SVar19;
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  ChMatrixNM<double,_6,_6> D;
  VectorNIP E1_Block;
  VectorNIP E2_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP E4_Block;
  VectorNIP E5_Block;
  VectorNIP E3_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP E6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  Matrix3xN e_bar;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_5910;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58f0;
  XprTypeNested local_58e8;
  long local_58e0;
  Matrix<double,__1,__1,_0,__1,__1> *local_58d8;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_58d0;
  ChVariables **local_58b0;
  Matrix<double,__1,__1,_1,__1,__1> *local_58a8;
  Matrix<double,__1,__1,_1,__1,__1> *local_58a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5898;
  Matrix<double,__1,__1,_1,__1,__1> *local_5890;
  Matrix<double,__1,__1,_1,__1,__1> *local_5888;
  XprTypeNested local_5880;
  XprTypeNested local_5878;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> local_5870;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_5840;
  undefined8 *local_5828;
  ChVariables **local_5820;
  Matrix<double,__1,__1,_1,__1,__1> *local_5818;
  Matrix<double,__1,__1,_1,__1,__1> *local_5810;
  ChVariables **local_5808;
  Matrix<double,__1,__1,_1,__1,__1> *local_5800;
  Matrix<double,__1,__1,_1,__1,__1> *local_57f8;
  XprTypeNested local_57f0;
  Matrix<double,__1,__1,_1,__1,__1> *local_57e8;
  undefined1 local_57e0 [16];
  scalar_constant_op<double> sStack_57d0;
  variable_if_dynamic<long,__1> vStack_57c8;
  variable_if_dynamic<long,__1> vStack_57c0;
  RhsNested pMStack_57b8;
  XprTypeNested local_57a0;
  long local_5798;
  ChMatrixNM<double,_6,_6> local_5780;
  undefined1 local_5660 [8];
  undefined1 auStack_5658 [16];
  variable_if_dynamic<long,__1> vStack_5648;
  variable_if_dynamic<long,__1> vStack_5640;
  RhsNested pMStack_5638;
  scalar_constant_op<double> sStack_5630;
  variable_if_dynamic<long,__1> vStack_5628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5620;
  LhsNested local_5610;
  scalar_constant_op<double> sStack_5608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5600;
  scalar_constant_op<double> sStack_55f8;
  variable_if_dynamic<long,__1> vStack_55f0;
  LhsNested LStack_55e8;
  LhsNested local_55c8;
  undefined8 auStack_55c0 [41];
  double *local_5478;
  double *local_5470;
  double *local_5468;
  ChElementShellANCF_3443 *local_5460;
  long local_5458;
  long local_5450;
  element_type *local_5448;
  double local_5440;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> local_5438;
  undefined1 (*local_5408) [32];
  undefined1 local_5400 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_53f0;
  variable_if_dynamic<long,__1> vStack_53e8;
  variable_if_dynamic<long,__1> vStack_53e0;
  scalar_constant_op<double> sStack_53d8;
  undefined1 local_5258 [16];
  scalar_constant_op<double> sStack_5248;
  variable_if_dynamic<long,__1> vStack_5240;
  scalar_constant_op<double> sStack_5238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5230;
  XprTypeNested local_5218;
  scalar_constant_op<double> local_5210;
  undefined1 local_51c0 [16];
  non_const_type pMStack_51b0;
  variable_if_dynamic<long,__1> vStack_51a8;
  variable_if_dynamic<long,__1> vStack_51a0;
  XprTypeNested pMStack_5198;
  double dStack_5190;
  XprTypeNested pMStack_5188;
  double dStack_5180;
  double dStack_5178;
  RhsNested pMStack_5170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5150;
  _func_int **pp_Stack_5148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5140;
  RhsNested local_5138;
  double dStack_5130;
  double dStack_5128;
  RhsNested pMStack_5120;
  double local_50f8;
  undefined1 local_50f0 [80];
  undefined1 local_50a0 [16];
  scalar_constant_op<double> sStack_5090;
  RhsNested pMStack_5088;
  scalar_constant_op<double> sStack_5080;
  scalar_constant_op<double> sStack_5078;
  variable_if_dynamic<long,__1> vStack_5070;
  variable_if_dynamic<long,__1> vStack_5068;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_5060;
  scalar_constant_op<double> local_5058;
  Matrix<double,_32,_1,_0,_32,_1> local_4fc0;
  undefined1 local_4ec0 [16];
  scalar_constant_op<double> sStack_4eb0;
  variable_if_dynamic<long,__1> vStack_4ea8;
  variable_if_dynamic<long,__1> vStack_4ea0;
  RhsNested pMStack_4e98;
  variable_if_dynamic<long,__1> vStack_4e90;
  variable_if_dynamic<long,__1> vStack_4e88;
  RhsNested pMStack_4e80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_4da8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
  local_4d80 [3];
  undefined1 local_4c80 [16];
  scalar_constant_op<double> sStack_4c70;
  variable_if_dynamic<long,__1> vStack_4c68;
  variable_if_dynamic<long,__1> vStack_4c60;
  XprTypeNested pMStack_4c58;
  variable_if_dynamic<long,__1> vStack_4c50;
  variable_if_dynamic<long,__1> vStack_4c48;
  RhsNested pMStack_4c40;
  Matrix<double,_32,_1,_0,_32,_1> local_4b80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_4a68;
  Matrix<double,_32,_1,_0,_32,_1> local_4a40;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
  local_4940 [3];
  PointerType pdStack_4840;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4838;
  RhsNested local_4830;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4828;
  RhsNested pMStack_4820;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4818;
  PointerType pdStack_4800;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_47f8;
  RhsNested local_47f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_47e8;
  RhsNested pMStack_47e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_47d8;
  PointerType pdStack_47c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_47b8;
  RhsNested local_47b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_47a8;
  RhsNested pMStack_47a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4798;
  Matrix<double,_32,_1,_0,_32,_1> local_4780;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_4668;
  Matrix<double,_32,_1,_0,_32,_1> local_4640;
  Matrix<double,_32,_1,_0,_32,_1> local_4540;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_4428;
  undefined1 local_4400 [16];
  scalar_constant_op<double> sStack_43f0;
  undefined1 auStack_43e8 [16];
  undefined1 auStack_43d8 [16];
  scalar_constant_op<double> local_43c8;
  XprTypeNested local_43c0;
  variable_if_dynamic<long,__1> local_43b8;
  variable_if_dynamic<long,__1> vStack_43b0;
  variable_if_dynamic<long,__1> local_43a8;
  scalar_constant_op<double> sStack_43a0;
  RhsNested local_4398;
  element_type *peStack_4390;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4380;
  scalar_constant_op<double> sStack_4378;
  scalar_constant_op<double> sStack_4370;
  RhsNested pMStack_4368;
  XprTypeNested local_4360;
  variable_if_dynamic<long,__1> local_4358;
  variable_if_dynamic<long,__1> local_4350;
  variable_if_dynamic<long,__1> local_4348;
  scalar_constant_op<double> local_4340;
  RhsNested local_4338;
  double local_4330;
  Matrix<double,__1,__1,_1,__1,__1> *local_4318;
  XprTypeNested local_4308;
  variable_if_dynamic<long,__1> local_4300;
  variable_if_dynamic<long,__1> local_42f8;
  double local_42f0;
  Matrix<double,__1,__1,_1,__1,__1> *local_42e8;
  XprTypeNested local_42d8;
  double local_42d0;
  scalar_constant_op<double> local_42c8;
  PointerType local_42c0;
  undefined1 local_1400 [512];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1200 [10];
  ChVariables *apCStack_1100 [32];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1000 [10];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_f00 [10];
  ChVariables *apCStack_e00 [32];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_d00 [10];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_c00 [10];
  undefined1 local_b00 [768];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_800 [16];
  Matrix<double,__1,__1,_1,__1,__1> local_700 [10];
  Matrix<double,__1,__1,_1,__1,__1> local_600 [10];
  ChVariables *local_500 [32];
  Matrix<double,__1,__1,_1,__1,__1> local_400 [10];
  Matrix<double,__1,__1,_1,__1,__1> local_300 [10];
  Matrix3xN local_200;
  
  local_5440 = Kfactor;
  CalcCoordMatrix(this,&local_200);
  Eigen::
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)H);
  local_5878 = (XprTypeNested)(local_b00 + 0x200);
  xpr = &this->m_SD;
  local_5898 = local_800;
  local_5808 = apCStack_1100;
  local_57e8 = aMStack_1200;
  local_5890 = local_700;
  local_58a8 = local_400;
  local_5818 = aMStack_d00;
  local_5800 = aMStack_1000;
  local_5888 = local_600;
  local_58a0 = local_300;
  local_57f8 = aMStack_f00;
  local_5810 = aMStack_c00;
  local_5408 = (undefined1 (*) [32])local_50f0;
  local_5470 = local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1a;
  local_58b0 = local_500;
  local_5820 = apCStack_e00;
  local_5880 = (XprTypeNested)(local_b00 + 0x100);
  local_57f0 = (XprTypeNested)(local_1400 + 0x100);
  local_5478 = local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x20;
  local_5468 = local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x14;
  local_5828 = auStack_55c0;
  local_58d8 = &this->m_kGQ;
  lVar17 = 0;
  local_5460 = this;
  local_5448 = (element_type *)H;
  while( true ) {
    if (local_5460->m_numLayers <= lVar17) break;
    startCol = lVar17 * 0x60;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_16,_96,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false> *)local_1400,xpr,0,
               startCol);
    auVar2 = _auStack_43e8;
    auStack_43e8._8_8_ = local_1400._32_8_;
    auStack_43e8._0_8_ = local_1400._24_8_;
    auStack_43d8._8_8_ = auVar2._24_8_;
    auStack_43d8._0_8_ = local_1400._40_8_;
    local_4400._8_8_ = local_1400._8_8_;
    local_4400._0_8_ = local_1400._0_8_;
    sStack_43f0.m_other = (double)local_1400._16_8_;
    auStack_43d8._8_8_ = &local_200;
    Eigen::PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,16,96,false>>,Eigen::Transpose<Eigen::Matrix<double,3,16,1,3,16>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>> *)local_b00,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_0>_>
                *)local_4400);
    local_58d0.m_storage.m_cols = 0;
    local_58d0.m_storage.m_data = (double *)0x0;
    local_58d0.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_58d0,0x30,0xc0)
    ;
    lVar18 = 0;
    lVar16 = 0;
    lVar13 = lVar17 * 0x6000000000 + 0x2000000000 >> 0x20;
    lVar15 = lVar17 * 0x6000000000 + 0x4000000000 >> 0x20;
    local_5458 = lVar17;
    while( true ) {
      if (lVar16 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      auStack_43d8._8_8_ = local_43c0;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar13);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_5880;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar15);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._8_8_;
      local_4400._0_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_5878;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,lVar13);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_5880;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = local_5878;
      local_4348.m_value = 0x40;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      local_43c8.m_other = (double)local_b00;
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = local_5878;
      local_4348.m_value = 0x40;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_43b8.m_value = (long)local_43c8.m_other;
      local_4350.m_value = (long)local_43c8.m_other;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar13);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      local_43c8.m_other = (double)local_b00;
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = local_5880;
      local_4348.m_value = 0x20;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_43b8.m_value = (long)local_43c8.m_other;
      local_4350.m_value = (long)local_43c8.m_other;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar18,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_b00;
      lVar17 = lVar18 + 1;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_5898;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      local_58e0 = lVar18;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar13);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_5890;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar15);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._8_8_;
      local_4400._0_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_5888;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,lVar13);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_5890;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5888;
      local_4348.m_value = 0x40;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_5898;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5888;
      local_4348.m_value = 0x40;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar13);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_5898;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5890;
      local_4348.m_value = 0x20;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_58b0;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      lVar17 = local_58e0 + 2;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar13);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._0_8_ = local_1400._0_8_;
      local_4400._8_8_ = local_1400._8_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_58a8;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_1400,xpr,
                 lVar16,lVar15);
      local_43c0 = (XprTypeNested)local_b00;
      auStack_43e8._8_8_ = local_1400._32_8_;
      auStack_43e8._0_8_ = local_1400._24_8_;
      auStack_43d8._0_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._8_8_;
      local_4400._0_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._16_8_;
      auStack_43d8._8_8_ = local_58a0;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,lVar13);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_58a8;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_58a0;
      local_4348.m_value = 0x40;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar15);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      auStack_43d8._0_8_ = local_1400._32_8_;
      auStack_43d8._8_8_ = local_1400._40_8_;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_58b0;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_58a0;
      local_4348.m_value = 0x40;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar16,lVar13);
      local_1400._32_8_ = vStack_5640.m_value;
      local_1400._40_8_ = pMStack_5638;
      local_1400._0_8_ = local_5660;
      local_1400._8_8_ = auStack_5658._0_8_;
      local_1400._16_8_ = auStack_5658._8_8_;
      local_1400._24_8_ = vStack_5648.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar16,startCol);
      auVar3._8_8_ = local_1400._24_8_;
      auVar3._0_8_ = local_1400._16_8_;
      auVar3._16_8_ = local_1400._32_8_;
      auVar3._24_8_ = local_1400._40_8_;
      sStack_4370.m_other = (double)vStack_53e0.m_value;
      pMStack_4368 = (RhsNested)sStack_53d8.m_other;
      peStack_4390 = (element_type *)local_5400._0_8_;
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5400._8_8_;
      local_4380 = p_Stack_53f0;
      sStack_4378.m_other = (double)vStack_53e8.m_value;
      local_4400._8_8_ = local_1400._0_8_;
      sStack_43f0.m_other = (double)local_1400._8_8_;
      auStack_43d8 = auVar3._16_16_;
      auStack_43e8._8_8_ = local_1400._24_8_;
      auStack_43e8._0_8_ = local_1400._16_8_;
      local_43b8.m_value = (long)local_b00;
      local_43c8.m_other = (double)local_58b0;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_58a8;
      local_4348.m_value = 0x20;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_58d0,lVar17,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      lVar16 = lVar16 + 1;
      lVar18 = local_58e0 + 3;
    }
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>
                      *)local_4400,&local_5440,(StorageBaseType *)local_b00);
    Eigen::PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,96,3,0,96,3>const>const,Eigen::Matrix<double,96,3,0,96,3>const>>
              ((PlainObjectBase<Eigen::Matrix<double,96,3,0,96,3>> *)local_1400,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>,_const_Eigen::Matrix<double,_96,_3,_0,_96,_3>_>_>
                *)local_4400);
    lVar17 = 0;
    lVar16 = local_5458 << 5;
    while( true ) {
      if (lVar17 == 3) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
                 local_58d8,lVar16,0);
      auVar2 = _auStack_43e8;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_5780,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1400,0,lVar17);
      vStack_53e0.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_53d8.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5400._0_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5400._8_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      p_Stack_53f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[2];
      vStack_53e8.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5400,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
                 local_58d8,lVar16,0);
      auVar12 = stack0xffffffffffffbc20;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar12._16_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_5780,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1400,0x20,lVar17);
      vStack_53e0.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_53d8.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5400._0_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5400._8_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      p_Stack_53f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[2];
      vStack_53e8.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5400,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
                 local_58d8,lVar16,0);
      auVar12 = stack0xffffffffffffbc20;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar12._16_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._8_8_ = auStack_5658._0_8_;
      local_4400._0_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false> *)&local_5780,
                 (Matrix<double,_96,_3,_0,_96,_3> *)local_1400,0x40,lVar17);
      vStack_53e0.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_53d8.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_5400._0_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_5400._8_8_ =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      p_Stack_53f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[2];
      vStack_53e8.m_value =
           (long)local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>>
                  *)local_5400,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                  *)local_4400);
      lVar17 = lVar17 + 1;
    }
    local_5910.m_storage.m_cols = 0;
    local_5910.m_storage.m_data = (double *)0x0;
    local_5910.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_5910,0x30,0xc0)
    ;
    lVar18 = 0;
    lVar17 = 0;
    local_58e0 = lVar16;
    while( true ) {
      pCVar4 = local_5460;
      lVar16 = local_58e0;
      if (lVar17 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      auStack_43d8._8_8_ = local_43c0;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar13);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_57f0;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar15);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._8_8_ = auStack_5658._0_8_;
      local_4400._0_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_57e8;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,lVar13);
      local_43b8.m_value = (long)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43c8.m_other = (double)local_57f0;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_57e8;
      local_4348.m_value = 0x40;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      local_43c8.m_other = (double)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_57e8;
      local_4348.m_value = 0x40;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_43b8.m_value = (long)local_43c8.m_other;
      local_4350.m_value = (long)local_43c8.m_other;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar13);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      local_43c8.m_other = (double)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 0;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_57f0;
      local_4348.m_value = 0x20;
      local_4340.m_other = 0.0;
      local_4338 = (RhsNested)0x60;
      local_43b8.m_value = (long)local_43c8.m_other;
      local_4350.m_value = (long)local_43c8.m_other;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar18,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_1400;
      lVar16 = lVar18 + 1;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_5808;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar13);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_5800;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar15);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._8_8_ = auStack_5658._0_8_;
      local_4400._0_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_57f8;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 1;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,lVar13);
      local_43b8.m_value = (long)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43c8.m_other = (double)local_5800;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_57f8;
      local_4348.m_value = 0x40;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      local_43b8.m_value = (long)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43c8.m_other = (double)local_5808;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_57f8;
      local_4348.m_value = 0x40;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar13);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      local_43b8.m_value = (long)local_1400;
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43c8.m_other = (double)local_5808;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 1;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5800;
      local_4348.m_value = 0x20;
      local_4340.m_other = 4.94065645841247e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,startCol);
      auVar2 = _auStack_43e8;
      local_43c0 = (XprTypeNested)local_1400;
      lVar16 = lVar18 + 2;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._8_8_ = auVar2._24_8_;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_5820;
      local_43b8.m_value = 0;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar13);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._0_8_ = local_5660;
      local_4400._8_8_ = auStack_5658._0_8_;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_5818;
      local_43b8.m_value = 0x20;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5660,xpr,
                 lVar17,lVar15);
      local_43c0 = (XprTypeNested)local_1400;
      auStack_43e8._8_8_ = vStack_5640.m_value;
      auStack_43e8._0_8_ = vStack_5648.m_value;
      auStack_43d8._0_8_ = pMStack_5638;
      local_4400._8_8_ = auStack_5658._0_8_;
      local_4400._0_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._8_8_;
      auStack_43d8._8_8_ = local_5810;
      local_43b8.m_value = 0x40;
      vStack_43b0.m_value = 2;
      local_43a8.m_value = 0x60;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,lVar13);
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43b8.m_value = (long)local_1400;
      local_43c8.m_other = (double)local_5818;
      vStack_43b0.m_value = 0x20;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5810;
      local_4348.m_value = 0x40;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x60);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar15);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43b8.m_value = (long)local_1400;
      local_43c8.m_other = (double)local_5820;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5810;
      local_4348.m_value = 0x40;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0x80);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5400,xpr,
                 lVar17,lVar13);
      vStack_5640.m_value = vStack_53e0.m_value;
      pMStack_5638 = (RhsNested)sStack_53d8.m_other;
      local_5660 = (undefined1  [8])local_5400._0_8_;
      auStack_5658._0_8_ = local_5400._8_8_;
      auStack_5658._8_8_ = p_Stack_53f0;
      vStack_5648.m_value = vStack_53e8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)&local_5780,xpr,
                 lVar17,startCol);
      sStack_4370.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      pMStack_4368 = (RhsNested)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      peStack_4390 = (element_type *)
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[0];
      local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_4380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_4378.m_other =
           local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_43e8._8_8_ = vStack_5648.m_value;
      auStack_43e8._0_8_ = auStack_5658._8_8_;
      auStack_43d8._0_8_ = vStack_5640.m_value;
      auStack_43d8._8_8_ = pMStack_5638;
      local_4400._8_8_ = local_5660;
      sStack_43f0.m_other = (double)auStack_5658._0_8_;
      local_43b8.m_value = (long)local_1400;
      local_43c8.m_other = (double)local_5820;
      vStack_43b0.m_value = 0;
      local_43a8.m_value = 2;
      sStack_43a0.m_other = 4.74303020007597e-322;
      local_4360 = (XprTypeNested)local_5818;
      local_4348.m_value = 0x20;
      local_4340.m_other = 9.88131291682493e-324;
      local_4338 = (RhsNested)0x60;
      local_4350.m_value = local_43b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,lVar16,0xa0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_51c0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                  *)local_4400);
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 3;
    }
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_4400,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_5460->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_material).
                       super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + local_58e0));
    memcpy(&local_5780,(ChMatrixNM<double,_6,_6> *)(local_4400._0_8_ + 0x20),0x120);
    this_01 = (ChElementShellANCF_3443 *)(local_4400 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    RotateReorderStiffnessMatrix
              (this_01,&local_5780,
               *(double *)
                ((long)&((pCVar4->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar16));
    local_5840.m_storage.m_cols = 0;
    local_5840.m_storage.m_data = (double *)0x0;
    local_5840.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_5840,0x30,0xc0)
    ;
    pauVar5 = local_5408;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,(double *)&local_5780,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar8 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_xpr;
    uVar7 = local_4d80[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>.
            _8_8_;
    pdVar6 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             .m_data;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *(PointerType *)*pauVar5 = pdVar6;
    *(undefined8 *)(*pauVar5 + 8) = uVar7;
    *(XprTypeNested *)(*pauVar5 + 0x10) = pMVar8;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar8 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_xpr;
    uVar7 = local_4d80[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>.
            _8_8_;
    pdVar6 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             .m_data;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *(PointerType *)*pauVar5 = pdVar6;
    *(undefined8 *)(*pauVar5 + 8) = uVar7;
    *(XprTypeNested *)(*pauVar5 + 0x10) = pMVar8;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0x20);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar8 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_xpr;
    uVar7 = local_4d80[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>.
            _8_8_;
    pdVar6 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             .m_data;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *(PointerType *)*pauVar5 = pdVar6;
    *(undefined8 *)(*pauVar5 + 8) = uVar7;
    *(XprTypeNested *)(*pauVar5 + 0x10) = pMVar8;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0x40);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x12,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,local_5468,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar8 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_xpr;
    uVar7 = local_4d80[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>.
            _8_8_;
    pdVar6 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             .m_data;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *(PointerType *)*pauVar5 = pdVar6;
    *(undefined8 *)(*pauVar5 + 8) = uVar7;
    *(XprTypeNested *)(*pauVar5 + 0x10) = pMVar8;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0x60);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,local_5470,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    pMVar8 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_xpr;
    uVar7 = local_4d80[0].m_rhs.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>.
            _8_8_;
    pdVar6 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
             .m_data;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *(PointerType *)*pauVar5 = pdVar6;
    *(undefined8 *)(*pauVar5 + 8) = uVar7;
    *(XprTypeNested *)(*pauVar5 + 0x10) = pMVar8;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0x80);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4780,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4c80,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)&local_4780);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_4a40,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x20);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)local_4ec0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)&local_4a40);
    local_58e8 = (XprTypeNested)sStack_4c70.m_other;
    local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_4eb0.m_other;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4c68.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4c60.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4c58;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4c50.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4c48.m_value;
    local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4c40;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)vStack_4ea8.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [1] = (double)vStack_4ea0.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4e98;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4e90.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4e88.m_value;
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [5] = (double)pMStack_4e80;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_50a0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x40);
    Eigen::operator*(local_4d80,local_5478,(StorageBaseType *)local_50a0);
    IVar11 = local_4d80[0].m_rhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
             m_outerStride;
    vVar10.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startCol.m_value;
    vVar9.m_value =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    vStack_51a0.m_value = (long)local_58e8;
    dStack_5178 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5170 = (RhsNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pMStack_5198 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[0];
    dStack_5190 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[1];
    pMStack_5188 = (XprTypeNested)
                   local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[2];
    dStack_5180 = local_4b80.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_5150 = local_58f0;
    dStack_5128 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[4];
    pMStack_5120 = (RhsNested)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[5];
    pp_Stack_5148 =
         (_func_int **)
         local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
         array[0];
    p_Stack_5140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                   m_storage.m_data.array[1];
    local_5138 = (RhsNested)
                 local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage
                 .m_data.array[2];
    dStack_5130 = local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.
                  m_storage.m_data.array[3];
    local_50f8 = local_4d80[0].m_lhs.m_functor.m_other;
    auVar2._8_8_ = local_4d80[0].m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
                   ._8_8_;
    auVar2._0_8_ = local_4d80[0].m_rhs.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>,_0>
                   .m_data;
    auVar2._16_8_ =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    auVar2._24_8_ =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.
         m_startRow.m_value;
    *(XprTypeNested *)(*pauVar5 + 0x10) =
         local_4d80[0].m_rhs.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>.m_xpr;
    *(long *)(*pauVar5 + 0x18) = vVar9.m_value;
    *(long *)pauVar5[1] = vVar10.m_value;
    *(Index *)(pauVar5[1] + 8) = IVar11;
    *pauVar5 = auVar2;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_5258,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x60);
    Eigen::operator*(local_4940,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_5258);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_51c0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_4940);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)local_57e0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0x80);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4540,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_57e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4540);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false> *)&local_5870,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_5910,0,0xa0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>
                      *)&local_4640,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)&local_5870);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,48,32,false>const>const>>
    ::operator+((CwiseBinaryOp<_149c88d9_> *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_48,_32,_1,_48,_32>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false>_>_>
                 *)&local_4640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_48,_32,_false>::Block
              (&local_5438,(Matrix<double,__1,__1,_1,__1,__1> *)&local_5840,0,0xa0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,48,32,1,48,32>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,48,32,false>const>const>>
              (&local_5438,(CwiseBinaryOp<_149c88d9_> *)local_4400);
    local_5660 = (undefined1  [8])&local_5840;
    local_4400 = (undefined1  [16])
                 Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_58d0,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                             *)local_5660);
    local_5400._0_8_ = H;
    Eigen::
    NoAlias<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::MatrixBase>
    ::operator+=((NoAlias<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::MatrixBase>
                  *)local_5400,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
                  *)local_4400);
    sStack_43f0.m_other = (double)local_b00;
    auStack_43e8 = CONCAT88(sStack_43f0.m_other,auStack_43e8._0_8_);
    _auStack_43e8 = ZEXT1632(auStack_43e8);
    local_43c8.m_other = 4.74303020007597e-322;
    local_43a8.m_value = 0;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = local_5898;
    sStack_4370.m_other = 0.0;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5898;
    local_4340.m_other = 0.0;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = (Matrix<double,__1,__1,_1,__1,__1> *)local_58b0;
    local_4300.m_value = 0;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = (Matrix<double,__1,__1,_1,__1,__1> *)local_58b0;
    local_42d0 = 0.0;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    local_43c0 = (XprTypeNested)sStack_43f0.m_other;
    vStack_43b0.m_value = (long)sStack_43f0.m_other;
    sStack_4378.m_other = sStack_43f0.m_other;
    local_4348.m_value = (long)sStack_43f0.m_other;
    local_4308 = (XprTypeNested)sStack_43f0.m_other;
    local_42d8 = (XprTypeNested)sStack_43f0.m_other;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_5400,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    local_4400._0_8_ = &DAT_3ff0000000000000;
    local_5660 = (undefined1  [8])local_5400;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_5660,(Scalar *)local_4400);
    local_4c80._0_8_ = (PointerType)0x3fe0000000000000;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_51c0,
               local_58d8,local_58e0,0);
    vStack_5640.m_value = vStack_51a0.m_value;
    pMStack_5638 = (RhsNested)pMStack_5198;
    local_5660 = (undefined1  [8])local_51c0._0_8_;
    auStack_5658._0_8_ = local_51c0._8_8_;
    auStack_5658._8_8_ = pMStack_51b0;
    vStack_5648.m_value = vStack_51a8.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                      *)local_4400,(double *)local_4c80,(StorageBaseType *)local_5660);
    local_4ec0._0_8_ = local_5400;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_4ec0,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>_>
                *)local_4400);
    vStack_43b0.m_value = (long)local_b00;
    sStack_43f0.m_other = (double)local_5880;
    auStack_43e8._8_8_ = vStack_43b0.m_value;
    auStack_43d8._0_8_ = 0x20;
    auStack_43d8._8_8_ = 0;
    local_43c8.m_other = 4.74303020007597e-322;
    local_43c0 = local_5880;
    local_43a8.m_value = 0x20;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5890;
    sStack_4370.m_other = 1.58101006669199e-322;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5890;
    local_4340.m_other = 1.58101006669199e-322;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = local_58a8;
    local_4300.m_value = 0x20;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = local_58a8;
    local_42d0 = 1.58101006669199e-322;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    sStack_4378.m_other = (double)vStack_43b0.m_value;
    local_4348.m_value = vStack_43b0.m_value;
    local_4308 = (XprTypeNested)vStack_43b0.m_value;
    local_42d8 = (XprTypeNested)vStack_43b0.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_51c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    local_4400._0_8_ = &DAT_3ff0000000000000;
    local_5660 = (undefined1  [8])local_51c0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_5660,(Scalar *)local_4400);
    local_4ec0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_4c80,
               local_58d8,local_58e0,0);
    vStack_5640.m_value = vStack_4c60.m_value;
    pMStack_5638 = (RhsNested)pMStack_4c58;
    local_5660 = (undefined1  [8])local_4c80._0_8_;
    auStack_5658._0_8_ = local_4c80._8_8_;
    auStack_5658._8_8_ = sStack_4c70.m_other;
    vStack_5648.m_value = vStack_4c68.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                      *)local_4400,(double *)local_4ec0,(StorageBaseType *)local_5660);
    local_4d80[0]._0_8_ = local_51c0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_4d80,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>_>
                *)local_4400);
    vStack_43b0.m_value = (long)local_b00;
    sStack_43f0.m_other = (double)local_5878;
    auStack_43e8._8_8_ = vStack_43b0.m_value;
    auStack_43d8._0_8_ = 0x40;
    auStack_43d8._8_8_ = 0;
    local_43c8.m_other = 4.74303020007597e-322;
    local_43c0 = local_5878;
    local_43a8.m_value = 0x40;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5888;
    sStack_4370.m_other = 3.16202013338398e-322;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5888;
    local_4340.m_other = 3.16202013338398e-322;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = local_58a0;
    local_4300.m_value = 0x40;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = local_58a0;
    local_42d0 = 3.16202013338398e-322;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    sStack_4378.m_other = (double)vStack_43b0.m_value;
    local_4348.m_value = vStack_43b0.m_value;
    local_4308 = (XprTypeNested)vStack_43b0.m_value;
    local_42d8 = (XprTypeNested)vStack_43b0.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_4c80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    local_4400._0_8_ = &DAT_3ff0000000000000;
    local_5660 = (undefined1  [8])local_4c80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_> *)
               local_5660,(Scalar *)local_4400);
    lVar17 = local_58e0;
    local_4d80[0]._0_8_ = (undefined1 *)0x3fe0000000000000;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_4ec0,
               local_58d8,local_58e0,0);
    vStack_5640.m_value = vStack_4ea0.m_value;
    pMStack_5638 = pMStack_4e98;
    local_5660 = (undefined1  [8])local_4ec0._0_8_;
    auStack_5658._0_8_ = local_4ec0._8_8_;
    auStack_5658._8_8_ = sStack_4eb0.m_other;
    vStack_5648.m_value = vStack_4ea8.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                      *)local_4400,(double *)local_4d80,(StorageBaseType *)local_5660);
    local_4940[0]._0_8_ = local_4c80;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_4940,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_32,_1,_0,_32,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>_>
                *)local_4400);
    sStack_43f0.m_other = (double)local_5880;
    vStack_43b0.m_value = (long)local_b00;
    auStack_43e8._8_8_ = vStack_43b0.m_value;
    auStack_43d8._0_8_ = 0x20;
    auStack_43d8._8_8_ = 0;
    local_43c8.m_other = 4.74303020007597e-322;
    local_43c0 = local_5878;
    local_43a8.m_value = 0x40;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5890;
    sStack_4370.m_other = 1.58101006669199e-322;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5888;
    local_4340.m_other = 3.16202013338398e-322;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = local_58a8;
    local_4300.m_value = 0x20;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = local_58a0;
    local_42d0 = 3.16202013338398e-322;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    sStack_4378.m_other = (double)vStack_43b0.m_value;
    local_4348.m_value = vStack_43b0.m_value;
    local_4308 = (XprTypeNested)vStack_43b0.m_value;
    local_42d8 = (XprTypeNested)vStack_43b0.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_4ec0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
               local_58d8,lVar17,0);
    auVar2 = _auStack_43e8;
    local_4d80[0]._0_8_ = local_4ec0;
    auStack_43e8._8_8_ = vStack_5640.m_value;
    auStack_43e8._0_8_ = vStack_5648.m_value;
    auStack_43d8._8_8_ = auVar2._24_8_;
    auStack_43d8._0_8_ = pMStack_5638;
    local_4400._0_8_ = local_5660;
    local_4400._8_8_ = auStack_5658._0_8_;
    sStack_43f0.m_other = (double)auStack_5658._8_8_;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_4d80,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_4400);
    sStack_43f0.m_other = (double)local_b00;
    auStack_43e8 = CONCAT88(sStack_43f0.m_other,auStack_43e8._0_8_);
    _auStack_43e8 = ZEXT1632(auStack_43e8);
    local_43c8.m_other = 4.74303020007597e-322;
    local_43c0 = local_5878;
    local_43a8.m_value = 0x40;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = local_5898;
    sStack_4370.m_other = 0.0;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5888;
    local_4340.m_other = 3.16202013338398e-322;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = (Matrix<double,__1,__1,_1,__1,__1> *)local_58b0;
    local_4300.m_value = 0;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = local_58a0;
    local_42d0 = 3.16202013338398e-322;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    vStack_43b0.m_value = (long)sStack_43f0.m_other;
    sStack_4378.m_other = sStack_43f0.m_other;
    local_4348.m_value = (long)sStack_43f0.m_other;
    local_4308 = (XprTypeNested)sStack_43f0.m_other;
    local_42d8 = (XprTypeNested)sStack_43f0.m_other;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_4d80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
               local_58d8,local_58e0,0);
    auVar2 = _auStack_43e8;
    local_4940[0]._0_8_ = local_4d80;
    auStack_43e8._8_8_ = vStack_5640.m_value;
    auStack_43e8._0_8_ = vStack_5648.m_value;
    auStack_43d8._8_8_ = auVar2._24_8_;
    auStack_43d8._0_8_ = pMStack_5638;
    local_4400._0_8_ = local_5660;
    local_4400._8_8_ = auStack_5658._0_8_;
    sStack_43f0.m_other = (double)auStack_5658._8_8_;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)local_4940,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_4400);
    sStack_43f0.m_other = (double)local_b00;
    auStack_43e8 = CONCAT88(sStack_43f0.m_other,auStack_43e8._0_8_);
    _auStack_43e8 = ZEXT1632(auStack_43e8);
    local_43c8.m_other = 4.74303020007597e-322;
    local_43c0 = local_5880;
    local_43a8.m_value = 0x20;
    sStack_43a0.m_other = 0.0;
    local_4398 = (RhsNested)0x60;
    local_4388 = local_5898;
    sStack_4370.m_other = 0.0;
    pMStack_4368 = (RhsNested)0x1;
    local_4360 = (XprTypeNested)0x60;
    local_4358.m_value = (long)local_5890;
    local_4340.m_other = 1.58101006669199e-322;
    local_4338 = (RhsNested)0x1;
    local_4330 = 4.74303020007597e-322;
    local_4318 = (Matrix<double,__1,__1,_1,__1,__1> *)local_58b0;
    local_4300.m_value = 0;
    local_42f8.m_value = 2;
    local_42f0 = 4.74303020007597e-322;
    local_42e8 = local_58a8;
    local_42d0 = 1.58101006669199e-322;
    local_42c8.m_other = 9.88131291682493e-324;
    local_42c0 = (PointerType)0x60;
    vStack_43b0.m_value = (long)sStack_43f0.m_other;
    sStack_4378.m_other = sStack_43f0.m_other;
    local_4348.m_value = (long)sStack_43f0.m_other;
    local_4308 = (XprTypeNested)sStack_43f0.m_other;
    local_42d8 = (XprTypeNested)sStack_43f0.m_other;
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const,Eigen::Block<Eigen::Matrix<double,96,3,0,96,3>,32,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)local_4940,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_96,_3,_0,_96,_3>,_32,_1,_false>_>_>_>
                *)local_4400);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false> *)local_5660,
               local_58d8,local_58e0,0);
    auVar2 = _auStack_43e8;
    local_4540.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [0] = (double)local_4940;
    auStack_43e8._8_8_ = vStack_5640.m_value;
    auStack_43e8._0_8_ = vStack_5648.m_value;
    auStack_43d8._8_8_ = auVar2._24_8_;
    auStack_43d8._0_8_ = pMStack_5638;
    local_4400._8_8_ = auStack_5658._0_8_;
    local_4400._0_8_ = local_5660;
    sStack_43f0.m_other = (double)auStack_5658._8_8_;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,32,1,0,32,1>>> *)&local_4540,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_1,_false>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_4780,(double *)&local_5780,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_4a40,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)local_51c0);
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_4fc0.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_50a0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4b80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4fc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_50a0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5258,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4640,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4b80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5258);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_57e0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4640,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_57e0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5870);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4540,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_4a40,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_50a0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)local_51c0);
    local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[2];
    local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data
          .array[3];
    local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = sStack_5090.m_other;
    local_4780.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)pMStack_5088;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5258,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4fc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4780,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5258);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_57e0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4b80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4fc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_57e0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4b80,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5870);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5438,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5438);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4640,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_50a0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5258,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)local_51c0);
    local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [3] = sStack_5090.m_other;
    local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [4] = (double)pMStack_5088;
    local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [8] = sStack_5248.m_other;
    local_4a40.super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    [9] = (double)vStack_5240.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_57e0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4780,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4a40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_57e0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4fc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4780,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5870);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5438,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4fc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5438);
    Eigen::operator*(&local_4da8,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4da8);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4b80,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_5258,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x12,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_57e0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)local_51c0);
    pMStack_5088 = (RhsNested)sStack_5248.m_other;
    sStack_5080.m_other = (double)vStack_5240.m_value;
    p_Stack_5060 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_57d0.m_other;
    local_5058.m_other = (double)vStack_57c8.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,local_5468,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4a40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_50a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5870);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5438,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4780,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4a40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5438);
    Eigen::operator*(&local_4da8,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4780,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4da8);
    Eigen::operator*(&local_4a68,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4a68);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4fc0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)local_57e0,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)local_51c0);
    vStack_5240.m_value = (long)sStack_57d0.m_other;
    sStack_5238.m_other = (double)vStack_57c8.m_value;
    local_5218 = local_5870.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                 .m_xpr;
    local_5210.m_other =
         (double)local_5870.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                 .m_startRow.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5438,local_5470,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_50a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5258,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_5438);
    Eigen::operator*(&local_4da8,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4a40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_50a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4da8);
    Eigen::operator*(&local_4a68,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)&local_4a40,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4a68);
    Eigen::operator*(&local_4668,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4668);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4780,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5870,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_5400);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                      *)&local_5438,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)local_51c0);
    vStack_57c8.m_value =
         (long)local_5870.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
               m_xpr;
    vStack_57c0.m_value =
         local_5870.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
         m_startRow.m_value;
    local_57a0 = local_5438.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_xpr;
    local_5798 = local_5438.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_48,_32,_false,_true>
                 .m_startRow.m_value;
    Eigen::operator*(&local_4da8,local_5478,(StorageBaseType *)local_4c80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5258,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_57e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4da8);
    Eigen::operator*(&local_4a68,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_4ec0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_50a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5258,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4a68);
    Eigen::operator*(&local_4668,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)local_4d80);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_50a0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4668);
    Eigen::operator*(&local_4428,
                     local_5780.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_4940);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)local_4400,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
                 *)local_5660,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                 *)&local_4428);
    Eigen::PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,1,0,32,1>const>const,Eigen::Matrix<double,32,1,0,32,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,32,1,0,32,1>> *)&local_4a40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>_>
                *)local_4400);
    lVar17 = 0;
    while( true ) {
      if (lVar17 == 0x10) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5258,xpr,
                 lVar17,startCol);
      pMStack_47a0 = (RhsNested)sStack_5238.m_other;
      p_Stack_4798 = p_Stack_5230;
      pdStack_47c0 = (PointerType)local_5258._0_8_;
      p_Stack_47b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5258._8_8_;
      local_47b0 = (RhsNested)sStack_5248.m_other;
      p_Stack_47a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vStack_5240.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_57e0,xpr,
                 lVar17,lVar13);
      sStack_5080.m_other = (double)vStack_57c0.m_value;
      sStack_5078.m_other = (double)pMStack_57b8;
      local_50a0._0_8_ = local_57e0._0_8_;
      local_50a0._8_8_ = local_57e0._8_8_;
      sStack_5090.m_other = sStack_57d0.m_other;
      pMStack_5088 = (RhsNested)vStack_57c8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_5870,xpr,lVar17,lVar15);
      p_Stack_5620 = p_Stack_4798;
      vStack_5628.m_value = (long)pMStack_47a0;
      local_5610.m_matrix = &local_4a40;
      local_55c8.m_matrix = &local_4780;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_5828[4] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_5828[5] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_5630.m_other = (double)p_Stack_47a8;
      pMStack_5638 = local_47b0;
      vStack_5640.m_value = (long)p_Stack_47b8;
      vStack_5648.m_value = (long)pdStack_47c0;
      *local_5828 = local_5870.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_5828[1] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      auStack_5658._8_8_ = &local_4540;
      vStack_55f0.m_value = (long)pMStack_5088;
      sStack_55f8.m_other = sStack_5090.m_other;
      LStack_55e8._0_8_ = sStack_5080.m_other;
      LStack_55e8.m_functor.m_other = sStack_5078.m_other;
      sStack_5608.m_other = (double)local_50a0._0_8_;
      p_Stack_5600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50a0._8_8_;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (Matrix<double,_16,_96,_1,_16,_96> *)local_4400,lVar17,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_5660);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5258,xpr,
                 lVar17,startCol);
      pMStack_47e0 = (RhsNested)sStack_5238.m_other;
      p_Stack_47d8 = p_Stack_5230;
      pdStack_4800 = (PointerType)local_5258._0_8_;
      p_Stack_47f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5258._8_8_;
      local_47f0 = (RhsNested)sStack_5248.m_other;
      p_Stack_47e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vStack_5240.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_57e0,xpr,
                 lVar17,lVar13);
      sStack_5080.m_other = (double)vStack_57c0.m_value;
      sStack_5078.m_other = (double)pMStack_57b8;
      local_50a0._0_8_ = local_57e0._0_8_;
      local_50a0._8_8_ = local_57e0._8_8_;
      sStack_5090.m_other = sStack_57d0.m_other;
      pMStack_5088 = (RhsNested)vStack_57c8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_5870,xpr,lVar17,lVar15);
      p_Stack_5620 = p_Stack_47d8;
      vStack_5628.m_value = (long)pMStack_47e0;
      local_5610.m_matrix = &local_4640;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_5828[4] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_5828[5] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_5630.m_other = (double)p_Stack_47e8;
      pMStack_5638 = local_47f0;
      vStack_5640.m_value = (long)p_Stack_47f8;
      vStack_5648.m_value = (long)pdStack_4800;
      *local_5828 = local_5870.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_5828[1] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      auStack_5658._8_8_ = &local_4a40;
      local_55c8.m_matrix = &local_4fc0;
      vStack_55f0.m_value = (long)pMStack_5088;
      sStack_55f8.m_other = sStack_5090.m_other;
      LStack_55e8._0_8_ = sStack_5080.m_other;
      LStack_55e8.m_functor.m_other = sStack_5078.m_other;
      sStack_5608.m_other = (double)local_50a0._0_8_;
      p_Stack_5600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50a0._8_8_;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (Matrix<double,_16,_96,_1,_16,_96> *)local_4400,lVar17,0x20);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_5660);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_5258,xpr,
                 lVar17,startCol);
      pMStack_4820 = (RhsNested)sStack_5238.m_other;
      p_Stack_4818 = p_Stack_5230;
      pdStack_4840 = (PointerType)local_5258._0_8_;
      p_Stack_4838 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5258._8_8_;
      local_4830 = (RhsNested)sStack_5248.m_other;
      p_Stack_4828 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vStack_5240.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false> *)local_57e0,xpr,
                 lVar17,lVar13);
      sStack_5080.m_other = (double)vStack_57c0.m_value;
      sStack_5078.m_other = (double)pMStack_57b8;
      local_50a0._0_8_ = local_57e0._0_8_;
      local_50a0._8_8_ = local_57e0._8_8_;
      sStack_5090.m_other = sStack_57d0.m_other;
      pMStack_5088 = (RhsNested)vStack_57c8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_32,_false>::Block
                (&local_5870,xpr,lVar17,lVar15);
      p_Stack_5620 = p_Stack_4818;
      vStack_5628.m_value = (long)pMStack_4820;
      local_5610.m_matrix = &local_4fc0;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      local_5828[4] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startCol.m_value;
      local_5828[5] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_outerStride;
      sStack_5630.m_other = (double)p_Stack_4828;
      pMStack_5638 = local_4830;
      vStack_5640.m_value = (long)p_Stack_4838;
      vStack_5648.m_value = (long)pdStack_4840;
      *local_5828 = local_5870.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>
                    .m_data;
      local_5828[1] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>,_0>.
           _8_8_;
      local_5828[2] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.m_xpr
      ;
      local_5828[3] =
           local_5870.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false,_true>.
           m_startRow.m_value;
      auStack_5658._8_8_ = &local_4780;
      auVar1._8_8_ = pMStack_5088;
      auVar1._0_8_ = sStack_5090.m_other;
      auVar1._16_8_ = sStack_5080.m_other;
      auVar1._24_8_ = sStack_5078.m_other;
      local_55c8.m_matrix = &local_4b80;
      sStack_5608.m_other = (double)local_50a0._0_8_;
      p_Stack_5600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50a0._8_8_;
      LStack_55e8 = auVar1._16_16_;
      vStack_55f0.m_value = (long)pMStack_5088;
      sStack_55f8.m_other = sStack_5090.m_other;
      Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false>::Block
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (Matrix<double,_16,_96,_1,_16,_96> *)local_4400,lVar17,0x40);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,16,96,1,16,96>,1,32,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,32,1,0,32,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,32,false>const>const>>
                ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_32,_false> *)&local_5438,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_32,_false>_>_>
                  *)local_5660);
      lVar17 = lVar17 + 1;
    }
    local_5450 = 2;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      local_58e0 = lVar17 * 3;
      local_58e8 = (XprTypeNested)(lVar17 * 3 + 1);
      local_58f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar17 * 3 + 2);
      lVar15 = 0;
      lVar13 = local_5450;
      while( true ) {
        if (lVar13 == 0x32) break;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_96,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_96,_false> *)local_5258,xpr,
                   lVar17,startCol);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_96,_1,_1,_96>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_96,_false>_>
                          *)local_50a0,&local_5440,(StorageBaseType *)local_5258);
        Eigen::Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_96,_false>::Block
                  ((Block<Eigen::Matrix<double,_16,_96,_1,_16,_96>,_1,_96,_false> *)local_57e0,
                   (Matrix<double,_16,_96,_1,_16,_96> *)local_4400,lVar17 + lVar15,0);
        auVar2 = _sStack_55f8;
        vStack_55f0.m_value = vStack_57c0.m_value;
        sStack_55f8.m_other = (double)vStack_57c8.m_value;
        LStack_55e8.m_functor.m_other = auVar2._24_8_;
        LStack_55e8._0_8_ = pMStack_57b8;
        local_5610.m_matrix = (non_const_type)local_57e0._0_8_;
        sStack_5608.m_other = (double)local_57e0._8_8_;
        p_Stack_5600 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_57d0.m_other;
        auStack_5658._8_8_ = sStack_5090.m_other;
        vStack_5628.m_value = vStack_5068.m_value;
        p_Stack_5620 = p_Stack_5060;
        vStack_5648.m_value = (long)pMStack_5088;
        vStack_5640.m_value = (long)sStack_5080.m_other;
        pMStack_5638 = (RhsNested)sStack_5078.m_other;
        sStack_5630.m_other = (double)vStack_5070.m_value;
        SVar19 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base *)local_5660);
        pSVar14 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,local_58e0,lVar13 + -2);
        *pSVar14 = SVar19 + *pSVar14;
        pSVar14 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,(Index)local_58e8,lVar13 + -1);
        *pSVar14 = SVar19 + *pSVar14;
        pSVar14 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,(Index)local_58f0,lVar13);
        this_00 = local_5448;
        *pSVar14 = SVar19 + *pSVar14;
        if (lVar15 != 0) {
          pSVar14 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)local_5448,lVar13 + -2,local_58e0);
          *pSVar14 = SVar19 + *pSVar14;
          pSVar14 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)this_00,lVar13 + -1,(Index)local_58e8);
          *pSVar14 = SVar19 + *pSVar14;
          pSVar14 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                  *)this_00,lVar13,(Index)local_58f0);
          *pSVar14 = SVar19 + *pSVar14;
        }
        lVar13 = lVar13 + 3;
        lVar15 = lVar15 + 1;
        H = (ChMatrixRef *)local_5448;
      }
      local_5450 = local_5450 + 3;
    }
    Eigen::internal::handmade_aligned_free(local_5840.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_5910.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_58d0.m_storage.m_data);
    lVar17 = local_5458 + 1;
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntNoDamping(ChMatrixRef& H, double Kfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear material model (no damping).  For this style of method, the Jacobian of the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
        // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
        // will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31 ]
        // FC = [F12  F22  F32 ]
        //      [F13  F23  F33 ]
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * e_bar.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose());
            PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Scale the block deformation gradient matrix by the Kfactor weighting factor for the Jacobian and multiply
        // each Gauss quadrature component by its Gauss quadrature weight times the element Jacobian (kGQ)
        // =============================================================================
        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = Kfactor * FC;

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the scaled partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // and the other parameters to correctly integrate across the volume of the element.  This calculation is
        // performed in blocks across all the Gauss quadrature points at the same time.  This value should be store in
        // row major memory layout to align with the access patterns for calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================
        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
        // corresponding Gauss point (m_kGQ) for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block.array() *= 0.5 * m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}